

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

BOOL __thiscall
Memory::Recycler::CollectInternal<(Memory::CollectionFlags)553963520>(Recycler *this)

{
  size_t sVar1;
  BOOL BVar2;
  
  if (this->inDispose != false) {
    return 0;
  }
  (this->collectionParam).priorityBoostConcurrentSweepOverride = false;
  (this->collectionParam).finishOnly = false;
  (this->collectionParam).repeat = false;
  (this->collectionParam).flags = CollectNowFinalGC;
  (this->collectionParam).uncollectedAllocBytes = (this->autoHeap).uncollectedAllocBytes;
  (this->collectionParam).uncollectedNewPageCountPartialCollect =
       this->uncollectedNewPageCountPartialCollect;
  (this->collectionParam).inPartialCollectMode = this->inPartialCollectMode;
  sVar1 = (this->autoHeap).unusedPartialCollectFreeBytes;
  (this->collectionParam).uncollectedNewPageCount = (this->autoHeap).uncollectedNewPageCount;
  (this->collectionParam).unusedPartialCollectFreeBytes = sVar1;
  if ((this->collectionState).value != CollectionStateNotCollecting) {
    BVar2 = TryFinishConcurrentCollect<(Memory::CollectionFlags)553963520>(this);
    return BVar2;
  }
  BVar2 = Collect<(Memory::CollectionFlags)553963520>(this);
  return BVar2;
}

Assistant:

BOOL
Recycler::CollectInternal()
{
    // CollectHeuristic_Never flag should only be used with exhaustive candidate
    Assert((flags & CollectHeuristic_Never) == 0);

    // If we're in a re-entrant state, we want to allow GC to be triggered only
    // from allocation (or trigger points with AllowReentrant). This is to minimize
    // the number of reentrant GCs
    if ((flags & CollectOverride_AllowReentrant) == 0 && this->inDispose)
    {
        return false;
    }

#ifdef RECYCLER_TRACE
    CaptureCollectionParam(flags);
#endif

#if ENABLE_CONCURRENT_GC
    const BOOL concurrent = flags & CollectMode_Concurrent;
    const BOOL finishConcurrent = flags & CollectOverride_FinishConcurrent;

    // If we priority boosted, we should try to finish it every chance we get
    // Otherwise, we should finishing it if we are not doing a concurrent GC,
    // or the flags tell us to always try to finish a concurrent GC (CollectOverride_FinishConcurrent)
    if ((!concurrent || finishConcurrent || priorityBoost) && this->CollectionInProgress())
    {
        return TryFinishConcurrentCollect<flags>();
    }
#endif

    if (flags & CollectHeuristic_Mask)
    {
        // Check some heuristics first before starting a collection
        return CollectWithHeuristic<flags>();
    }

    // Start a collection now.
    return Collect<flags>();
}